

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall
nonius::optional<nonius::run_configuration>::destroy(optional<nonius::run_configuration> *this)

{
  long *plVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  
  if (this->initialized == true) {
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&this->storage + 0x58);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&this->storage + 0x48);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    plVar4 = *(long **)((long)&this->storage + 0x20);
    plVar1 = (long *)((long)&this->storage + 0x30);
    if (plVar4 != plVar1) {
      operator_delete(plVar4,*plVar1 + 1);
    }
    aVar2 = (anon_struct_8_0_00000001_for___align)((long)&this->storage + 0x10);
    if ((this->storage).__align != aVar2) {
      operator_delete((void *)(this->storage).__align,*(long *)aVar2 + 1);
    }
    this->initialized = false;
  }
  return;
}

Assistant:

void destroy() {
            if (initialized) {
                get_impl().~T();
                initialized = false;
            }
        }